

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugEventObject.cpp
# Opt level: O1

bool __thiscall
JsrtDebugDocumentManager::RemoveBreakpoint(JsrtDebugDocumentManager *this,UINT breakpointId)

{
  StatementLocation statement_00;
  bool bVar1;
  BreakpointDebugDocumentDictionary *this_00;
  undefined1 auStack_30 [8];
  StatementLocation statement;
  DebugDocument *debugDocument;
  UINT breakpointId_local;
  
  if (this->breakpointDebugDocumentDictionary != (BreakpointDebugDocumentDictionary *)0x0) {
    debugDocument._4_4_ = breakpointId;
    this_00 = GetBreakpointDictionary(this);
    statement.bytecodeSpan.begin = 0;
    statement.bytecodeSpan.end = 0;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_Js::DebugDocument_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>
                      (this_00,(uint *)((long)&debugDocument + 4),
                       (DebugDocument **)&statement.bytecodeSpan);
    if (bVar1) {
      statement.function = (FunctionBody *)0x0;
      statement.statement.begin = 0;
      statement.statement.end = 0;
      bVar1 = Js::DebugDocument::FindBPStatementLocation
                        ((DebugDocument *)statement.bytecodeSpan,debugDocument._4_4_,
                         (StatementLocation *)auStack_30);
      if (bVar1) {
        statement_00.statement = (Interval)statement.function;
        statement_00.function = (FunctionBody *)auStack_30;
        statement_00.bytecodeSpan = statement.statement;
        Js::DebugDocument::SetBreakPoint
                  ((DebugDocument *)statement.bytecodeSpan,statement_00,BREAKPOINT_DELETED);
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool JsrtDebugDocumentManager::RemoveBreakpoint(UINT breakpointId)
{
    if (this->breakpointDebugDocumentDictionary != nullptr)
    {
        BreakpointDebugDocumentDictionary* breakpointDebugDocumentDictionary = this->GetBreakpointDictionary();
        Js::DebugDocument* debugDocument = nullptr;
        if (breakpointDebugDocumentDictionary->TryGetValue(breakpointId, &debugDocument))
        {
            Js::StatementLocation statement;
            if (debugDocument->FindBPStatementLocation(breakpointId, &statement))
            {
                debugDocument->SetBreakPoint(statement, BREAKPOINT_DELETED);
                return true;
            }
        }
    }

    return false;
}